

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

BoxArray * __thiscall amrex::AmrMesh::MakeBaseGrids(BoxArray *__return_storage_ptr__,AmrMesh *this)

{
  pointer pGVar1;
  pointer pIVar2;
  pointer pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int idim;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  pointer pBVar15;
  long lVar16;
  BoxArray *pBVar17;
  int iVar18;
  byte bVar19;
  Box result;
  IntVect fac;
  Box result_1;
  Box local_98;
  int local_70 [3];
  IntVect local_64;
  undefined8 local_58;
  int iStack_50;
  int aiStack_4c [4];
  int local_3c [3];
  
  bVar19 = 0;
  local_64.vect[0] = 2;
  local_64.vect[1] = 2;
  local_64.vect[2] = 2;
  pGVar1 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)(pGVar1->domain).smallend.vect;
  uVar5 = *(undefined8 *)((pGVar1->domain).smallend.vect + 2);
  uVar6 = *(ulong *)((pGVar1->domain).bigend.vect + 2);
  local_98.bigend.vect[2] = (int)uVar6;
  local_98.btype.itype = (int)(uVar6 >> 0x20);
  local_98.smallend.vect[2] = (int)uVar5;
  local_3c[0] = 2;
  local_3c[1] = 2;
  local_3c[2] = 2;
  local_98.btype.itype = (uint)(uVar6 >> 0x20);
  local_98.bigend.vect[2] = (int)uVar6;
  local_98.bigend.vect[0] = (int)((long)uVar5 >> 0x21);
  local_98.bigend.vect[1] = (int)((long)*(undefined8 *)(pGVar1->domain).bigend.vect >> 0x21);
  if (local_98.btype.itype == 0) {
    local_98.bigend.vect[2] = local_98.bigend.vect[2] >> 1;
  }
  else {
    local_70[0] = 0;
    local_70[1] = 0;
    local_70[2] = 0;
    lVar16 = 0;
    do {
      if (((local_98.btype.itype >> ((uint)lVar16 & 0x1f) & 1) != 0) &&
         (local_98.bigend.vect[lVar16] % local_3c[lVar16] != 0)) {
        local_70[lVar16] = 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    local_98.bigend.vect[0] = (int)local_70._0_8_ + local_98.bigend.vect[0];
    local_98.bigend.vect[1] = SUB84(local_70._0_8_,4) + local_98.bigend.vect[1];
    local_98.bigend.vect[2] = (local_98.bigend.vect[2] >> 1) + local_70[2];
  }
  aiStack_4c[3] = local_98.btype.itype;
  local_58 = CONCAT44((int)((long)uVar4 >> 0x21) * 2,((int)uVar4 >> 1) * 2);
  iStack_50 = (local_98.smallend.vect[2] >> 1) << 1;
  aiStack_4c[0] = local_98.bigend.vect[0] * 2 + (~local_98.btype.itype & 1);
  aiStack_4c[1] = local_98.bigend.vect[1] * 2 + (~(local_98.btype.itype >> 1) & 1);
  aiStack_4c[2] = local_98.bigend.vect[2] * 2 + (uint)((uVar6 & 0x400000000) == 0);
  lVar16 = 0;
  do {
    if ((pGVar1->domain).bigend.vect[lVar16] - (pGVar1->domain).smallend.vect[lVar16] !=
        aiStack_4c[lVar16] - *(int *)((long)&local_58 + lVar16 * 4)) {
      local_64.vect[lVar16] = 1;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  lVar16 = *(long *)(pGVar1->domain).smallend.vect;
  lVar7 = *(long *)((pGVar1->domain).smallend.vect + 2);
  lVar8 = *(long *)(pGVar1->domain).bigend.vect;
  uVar4 = *(undefined8 *)((pGVar1->domain).bigend.vect + 2);
  local_98.bigend.vect[1] = (int)((ulong)lVar8 >> 0x20);
  local_98.bigend.vect[2] = (int)uVar4;
  local_98.btype.itype = SUB84(uVar4,4);
  local_98.smallend.vect[2] = (int)lVar7;
  local_98.bigend.vect[0] = (int)((ulong)lVar7 >> 0x20);
  iVar9 = local_64.vect[0];
  iVar10 = local_64.vect[1];
  local_98.smallend.vect[1] = (int)((ulong)lVar16 >> 0x20);
  uVar12 = local_98.smallend.vect[1];
  if (local_64.vect[1] == 1 && local_64.vect[0] == 1) {
    iVar18 = 1;
    local_98.smallend.vect._0_8_ = lVar16;
    if (local_64.vect[2] == 1) goto LAB_005a5d58;
  }
  else {
    local_98.smallend.vect[0] = (int)lVar16;
    if (local_64.vect[0] != 1) {
      if (local_64.vect[0] == 4) {
        if (local_98.smallend.vect[0] < 0) {
          local_98.smallend.vect[0] = local_98.smallend.vect[0] >> 2;
        }
        else {
          local_98.smallend.vect[0] = (uint)local_98.smallend.vect[0] >> 2;
        }
      }
      else if (local_64.vect[0] == 2) {
        if (local_98.smallend.vect[0] < 0) {
          local_98.smallend.vect[0] = local_98.smallend.vect[0] >> 1;
        }
        else {
          local_98.smallend.vect[0] = (uint)local_98.smallend.vect[0] >> 1;
        }
      }
      else if (local_98.smallend.vect[0] < 0) {
        local_98.smallend.vect[0] = ~(~local_98.smallend.vect[0] / local_64.vect[0]);
      }
      else {
        local_98.smallend.vect[0] = local_98.smallend.vect[0] / local_64.vect[0];
      }
    }
    if (local_64.vect[1] != 1) {
      if (local_64.vect[1] == 4) {
        if (lVar16 < 0) {
          uVar12 = local_98.smallend.vect[1] >> 2;
        }
        else {
          uVar12 = (uint)local_98.smallend.vect[1] >> 2;
        }
      }
      else if (local_64.vect[1] == 2) {
        if (lVar16 < 0) {
          uVar12 = local_98.smallend.vect[1] >> 1;
        }
        else {
          uVar12 = (uint)local_98.smallend.vect[1] >> 1;
        }
      }
      else if (lVar16 < 0) {
        uVar12 = ~(~local_98.smallend.vect[1] / local_64.vect[1]);
      }
      else {
        uVar12 = local_98.smallend.vect[1] / local_64.vect[1];
      }
    }
  }
  local_98.smallend.vect[1] = uVar12;
  if (local_64.vect[2] != 1) {
    if (local_64.vect[2] == 4) {
      if (local_98.smallend.vect[2] < 0) {
        local_98.smallend.vect[2] = local_98.smallend.vect[2] >> 2;
      }
      else {
        local_98.smallend.vect[2] = (uint)local_98.smallend.vect[2] >> 2;
      }
    }
    else if (local_64.vect[2] == 2) {
      if (local_98.smallend.vect[2] < 0) {
        local_98.smallend.vect[2] = local_98.smallend.vect[2] >> 1;
      }
      else {
        local_98.smallend.vect[2] = (uint)local_98.smallend.vect[2] >> 1;
      }
    }
    else if (local_98.smallend.vect[2] < 0) {
      local_98.smallend.vect[2] = ~(~local_98.smallend.vect[2] / local_64.vect[2]);
    }
    else {
      local_98.smallend.vect[2] = local_98.smallend.vect[2] / local_64.vect[2];
    }
  }
  local_98.btype.itype = SUB84(uVar4,4);
  local_98.bigend.vect[2] = (int)uVar4;
  if (local_98.btype.itype == 0) {
    uVar12 = local_98.bigend.vect[0];
    if (local_64.vect[0] != 1) {
      if (local_64.vect[0] == 4) {
        uVar12 = local_98.bigend.vect[0] >> 2;
        if (-1 < lVar7) {
          uVar12 = (uint)local_98.bigend.vect[0] >> 2;
        }
      }
      else if (local_64.vect[0] == 2) {
        uVar12 = local_98.bigend.vect[0] >> 1;
        if (-1 < lVar7) {
          uVar12 = (uint)local_98.bigend.vect[0] >> 1;
        }
      }
      else if (lVar7 < 0) {
        uVar12 = ~(~local_98.bigend.vect[0] / local_64.vect[0]);
      }
      else {
        uVar12 = local_98.bigend.vect[0] / local_64.vect[0];
      }
    }
    uVar14 = local_98.bigend.vect[1];
    if (local_64.vect[1] != 1) {
      if (local_64.vect[1] == 4) {
        uVar14 = local_98.bigend.vect[1] >> 2;
        if (-1 < lVar8) {
          uVar14 = (uint)local_98.bigend.vect[1] >> 2;
        }
      }
      else if (local_64.vect[1] == 2) {
        uVar14 = local_98.bigend.vect[1] >> 1;
        if (-1 < lVar8) {
          uVar14 = (uint)local_98.bigend.vect[1] >> 1;
        }
      }
      else if (lVar8 < 0) {
        uVar14 = ~(~local_98.bigend.vect[1] / local_64.vect[1]);
      }
      else {
        uVar14 = local_98.bigend.vect[1] / local_64.vect[1];
      }
    }
    uVar13 = local_98.bigend.vect[2];
    local_98.bigend.vect[0] = uVar12;
    local_98.bigend.vect[1] = uVar14;
    if (local_64.vect[2] != 1) {
      if (local_64.vect[2] == 4) {
        uVar13 = local_98.bigend.vect[2] >> 2;
        if (-1 < local_98.bigend.vect[2]) {
          uVar13 = (uint)local_98.bigend.vect[2] >> 2;
        }
      }
      else if (local_64.vect[2] == 2) {
        uVar13 = local_98.bigend.vect[2] >> 1;
        if (-1 < local_98.bigend.vect[2]) {
          uVar13 = (uint)local_98.bigend.vect[2] >> 1;
        }
      }
      else if (local_98.bigend.vect[2] < 0) {
        uVar13 = ~(~local_98.bigend.vect[2] / local_64.vect[2]);
      }
      else {
        uVar13 = local_98.bigend.vect[2] / local_64.vect[2];
      }
    }
  }
  else {
    local_70[0] = 0;
    local_70[1] = 0;
    local_70[2] = 0;
    lVar16 = 0;
    do {
      if (((local_98.btype.itype >> ((uint)lVar16 & 0x1f) & 1) != 0) &&
         (local_98.bigend.vect[lVar16] % local_64.vect[lVar16] != 0)) {
        local_70[lVar16] = 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    uVar12 = local_98.bigend.vect[0];
    if (local_64.vect[0] != 1) {
      if (local_64.vect[0] == 4) {
        uVar12 = local_98.bigend.vect[0] >> 2;
        if (-1 < lVar7) {
          uVar12 = (uint)local_98.bigend.vect[0] >> 2;
        }
      }
      else if (local_64.vect[0] == 2) {
        uVar12 = local_98.bigend.vect[0] >> 1;
        if (-1 < lVar7) {
          uVar12 = (uint)local_98.bigend.vect[0] >> 1;
        }
      }
      else if (lVar7 < 0) {
        uVar12 = ~(~local_98.bigend.vect[0] / local_64.vect[0]);
      }
      else {
        uVar12 = local_98.bigend.vect[0] / local_64.vect[0];
      }
    }
    uVar14 = local_98.bigend.vect[1];
    if (local_64.vect[1] != 1) {
      if (local_64.vect[1] == 4) {
        uVar14 = local_98.bigend.vect[1] >> 2;
        if (-1 < lVar8) {
          uVar14 = (uint)local_98.bigend.vect[1] >> 2;
        }
      }
      else if (local_64.vect[1] == 2) {
        uVar14 = local_98.bigend.vect[1] >> 1;
        if (-1 < lVar8) {
          uVar14 = (uint)local_98.bigend.vect[1] >> 1;
        }
      }
      else if (lVar8 < 0) {
        uVar14 = ~(~local_98.bigend.vect[1] / local_64.vect[1]);
      }
      else {
        uVar14 = local_98.bigend.vect[1] / local_64.vect[1];
      }
    }
    uVar13 = local_98.bigend.vect[2];
    if (local_64.vect[2] != 1) {
      if (local_64.vect[2] == 4) {
        uVar13 = local_98.bigend.vect[2] >> 2;
        if (-1 < local_98.bigend.vect[2]) {
          uVar13 = (uint)local_98.bigend.vect[2] >> 2;
        }
      }
      else if (local_64.vect[2] == 2) {
        uVar13 = local_98.bigend.vect[2] >> 1;
        if (-1 < local_98.bigend.vect[2]) {
          uVar13 = (uint)local_98.bigend.vect[2] >> 1;
        }
      }
      else if (local_98.bigend.vect[2] < 0) {
        uVar13 = ~(~local_98.bigend.vect[2] / local_64.vect[2]);
      }
      else {
        uVar13 = local_98.bigend.vect[2] / local_64.vect[2];
      }
    }
    uVar13 = uVar13 + local_70[2];
    local_98.bigend.vect[0] = uVar12 + local_70[0];
    local_98.bigend.vect[1] = uVar14 + local_70[1];
  }
  local_98.bigend.vect[2] = uVar13;
  iVar18 = local_64.vect[2];
LAB_005a5d58:
  BoxArray::BoxArray(__return_storage_ptr__,&local_98);
  pIVar2 = (this->super_AmrInfo).max_grid_size.
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_98.smallend.vect[2] = pIVar2->vect[2] / iVar18;
  local_98.smallend.vect._0_8_ =
       (long)pIVar2->vect[1] / (long)iVar10 << 0x20 |
       (long)pIVar2->vect[0] / (long)iVar9 & 0xffffffffU;
  BoxArray::maxSize(__return_storage_ptr__,&local_98.smallend);
  BoxArray::refine(__return_storage_ptr__,&local_64);
  if ((this->super_AmrInfo).refine_grid_layout == true) {
    ChopGrids(this,0,__return_storage_ptr__,*(int *)(ParallelContext::frames + 0x10));
  }
  bVar11 = BoxArray::operator==
                     (__return_storage_ptr__,
                      (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start);
  if (bVar11) {
    pBVar3 = (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar15 = pBVar3;
    pBVar17 = __return_storage_ptr__;
    for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
      *(undefined8 *)&pBVar17->m_bat = *(undefined8 *)&pBVar15->m_bat;
      pBVar15 = (pointer)((long)pBVar15 + ((ulong)bVar19 * -2 + 1) * 8);
      pBVar17 = (BoxArray *)((long)pBVar17 + (ulong)bVar19 * -0x10 + 8);
    }
    (__return_storage_ptr__->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pBVar3->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->m_ref).
                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pBVar3->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (__return_storage_ptr__->m_simplified_list).
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pBVar3->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->m_simplified_list).
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pBVar3->m_simplified_list).
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  (*this->_vptr_AmrMesh[5])(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BoxArray
AmrMesh::MakeBaseGrids () const
{
    IntVect fac(2);
    const Box& dom = geom[0].Domain();
    const Box dom2 = amrex::refine(amrex::coarsen(dom,2),2);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (dom.length(idim) != dom2.length(idim)) {
            fac[idim] = 1;
        }
    }
    BoxArray ba(amrex::coarsen(dom,fac));
    ba.maxSize(max_grid_size[0]/fac);
    ba.refine(fac);
    // Boxes in ba have even number of cells in each direction
    // unless the domain has odd number of cells in that direction.
    if (refine_grid_layout) {
        ChopGrids(0, ba, ParallelDescriptor::NProcs());
    }
    if (ba == grids[0]) {
        ba = grids[0];  // to avoid duplicates
    }
    PostProcessBaseGrids(ba);
    return ba;
}